

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-event.c
# Opt level: O0

void event_signal_point(game_event_type type,wchar_t x,wchar_t y)

{
  undefined1 local_48 [8];
  game_event_data data;
  wchar_t local_10;
  wchar_t y_local;
  wchar_t x_local;
  game_event_type type_local;
  
  local_48._0_4_ = x;
  local_48._4_4_ = y;
  data.explosion.centre.y = y;
  local_10 = x;
  y_local = type;
  game_event_dispatch(type,(game_event_data *)local_48);
  return;
}

Assistant:

void event_signal_point(game_event_type type, int x, int y)
{
	game_event_data data;
	data.point.x = x;
	data.point.y = y;

	game_event_dispatch(type, &data);
}